

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

void Commands::Info(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *arguments,Character *from)

{
  World *pWVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Character *this;
  mapped_type *this_00;
  string *this_01;
  PacketBuilder *this_02;
  allocator<char> local_111;
  PacketBuilder reply;
  string local_e0;
  string local_c0;
  string name;
  string local_80;
  string local_60;
  string local_40;
  
  pWVar1 = from->world;
  std::__cxx11::string::string
            ((string *)&local_40,
             (string *)
             (arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  this = World::GetCharacter(pWVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (this == (Character *)0x0) {
    pWVar1 = from->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reply,"character_not_found",(allocator<char> *)&name);
    I18N::Format<>(&local_60,&pWVar1->i18n,(string *)&reply);
    (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_60);
    this_01 = &local_60;
LAB_00120d60:
    std::__cxx11::string::~string((string *)this_01);
    this_02 = &reply;
    goto LAB_001211bb;
  }
  uVar2 = (**(this->super_Command_Source)._vptr_Command_Source)(this);
  pWVar1 = from->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reply,"cmdprotect",(allocator<char> *)&name);
  this_00 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar1->admin_config,(key_type *)&reply);
  iVar3 = util::variant::GetInt(this_00);
  if ((int)(uVar2 & 0xff) < iVar3) {
    std::__cxx11::string::~string((string *)&reply);
  }
  else {
    iVar3 = (**(this->super_Command_Source)._vptr_Command_Source)(this);
    iVar4 = (**(from->super_Command_Source)._vptr_Command_Source)(from);
    std::__cxx11::string::~string((string *)&reply);
    if ((byte)iVar4 < (byte)iVar3) {
      pWVar1 = from->world;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&reply,"command_access_denied",(allocator<char> *)&name);
      I18N::Format<>(&local_80,&pWVar1->i18n,(string *)&reply);
      (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_80);
      this_01 = &local_80;
      goto LAB_00120d60;
    }
  }
  (*(this->super_Command_Source)._vptr_Command_Source[2])(&reply,this);
  util::ucfirst(&name,(string *)&reply);
  std::__cxx11::string::~string((string *)&reply);
  PacketBuilder::PacketBuilder(&reply,PACKET_ADMININTERACT,PACKET_TELL,name._M_string_length + 0x55)
  ;
  switch(this->admin) {
  case ADMIN_GUIDE:
    pWVar1 = from->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"light_guide_title",&local_111);
    I18N::Format<std::__cxx11::string&>(&local_e0,&pWVar1->i18n,&local_c0,&name);
    PacketBuilder::AddString(&reply,&local_e0);
    break;
  case ADMIN_GUARDIAN:
    pWVar1 = from->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"guardian_title",&local_111);
    I18N::Format<std::__cxx11::string&>(&local_e0,&pWVar1->i18n,&local_c0,&name);
    PacketBuilder::AddString(&reply,&local_e0);
    break;
  case ADMIN_GM:
    pWVar1 = from->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"game_master_title",&local_111);
    I18N::Format<std::__cxx11::string&>(&local_e0,&pWVar1->i18n,&local_c0,&name);
    PacketBuilder::AddString(&reply,&local_e0);
    break;
  case ADMIN_HGM:
    pWVar1 = from->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"high_game_master_title",&local_111);
    I18N::Format<std::__cxx11::string&>(&local_e0,&pWVar1->i18n,&local_c0,&name);
    PacketBuilder::AddString(&reply,&local_e0);
    break;
  default:
    PacketBuilder::AddString(&reply,&name);
    goto LAB_00120f2c;
  }
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
LAB_00120f2c:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0," ",(allocator<char> *)&local_c0);
  PacketBuilder::AddString(&reply,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  Character::PaddedGuildTag_abi_cxx11_(&local_c0,this);
  util::trim(&local_e0,&local_c0);
  PacketBuilder::AddBreakString(&reply,&local_e0,0xff);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  iVar3 = Character::Usage(this);
  PacketBuilder::AddInt(&reply,iVar3);
  PacketBuilder::AddByte(&reply,0xff);
  PacketBuilder::AddByte(&reply,0xff);
  PacketBuilder::AddInt(&reply,this->exp);
  PacketBuilder::AddChar(&reply,(uint)this->level);
  PacketBuilder::AddShort(&reply,(int)this->mapid);
  PacketBuilder::AddShort(&reply,(uint)this->x);
  PacketBuilder::AddShort(&reply,(uint)this->y);
  PacketBuilder::AddShort(&reply,this->hp);
  PacketBuilder::AddShort(&reply,this->maxhp);
  PacketBuilder::AddShort(&reply,this->tp);
  PacketBuilder::AddShort(&reply,this->maxtp);
  PacketBuilder::AddShort(&reply,*this->display_str);
  PacketBuilder::AddShort(&reply,*this->display_intl);
  PacketBuilder::AddShort(&reply,*this->display_wis);
  PacketBuilder::AddShort(&reply,*this->display_agi);
  PacketBuilder::AddShort(&reply,*this->display_con);
  PacketBuilder::AddShort(&reply,*this->display_cha);
  PacketBuilder::AddShort(&reply,this->maxdam);
  PacketBuilder::AddShort(&reply,this->mindam);
  PacketBuilder::AddShort(&reply,this->accuracy);
  PacketBuilder::AddShort(&reply,this->evade);
  PacketBuilder::AddShort(&reply,this->armor);
  PacketBuilder::AddShort(&reply,0);
  PacketBuilder::AddShort(&reply,0);
  PacketBuilder::AddShort(&reply,0);
  PacketBuilder::AddShort(&reply,0);
  PacketBuilder::AddShort(&reply,0);
  PacketBuilder::AddShort(&reply,0);
  PacketBuilder::AddChar(&reply,this->weight);
  PacketBuilder::AddChar(&reply,this->maxweight);
  Character::Send(from,&reply);
  PacketBuilder::~PacketBuilder(&reply);
  this_02 = (PacketBuilder *)&name;
LAB_001211bb:
  std::__cxx11::string::~string((string *)this_02);
  return;
}

Assistant:

void Info(const std::vector<std::string>& arguments, Character* from)
{
	Character *victim = from->world->GetCharacter(arguments[0]);

	if (!victim)
	{
		from->ServerMsg(from->world->i18n.Format("character_not_found"));
	}
	else
	{
		if (victim->SourceAccess() < int(from->world->admin_config["cmdprotect"])
		 || victim->SourceAccess() <= from->SourceAccess())
		{
			std::string name = util::ucfirst(victim->SourceName());

			PacketBuilder reply(PACKET_ADMININTERACT, PACKET_TELL, 85 + name.length());

			switch (victim->admin)
			{
				case ADMIN_HGM:      reply.AddString(from->world->i18n.Format("high_game_master_title", name)); break;
				case ADMIN_GM:       reply.AddString(from->world->i18n.Format("game_master_title", name)); break;
				case ADMIN_GUARDIAN: reply.AddString(from->world->i18n.Format("guardian_title", name)); break;
				case ADMIN_GUIDE:    reply.AddString(from->world->i18n.Format("light_guide_title", name)); break;
				default:             reply.AddString(name);
			}

			reply.AddString(" ");
			reply.AddBreakString(util::trim(victim->PaddedGuildTag()));
			reply.AddInt(victim->Usage());
			reply.AddByte(255);
			reply.AddByte(255);
			reply.AddInt(victim->exp);
			reply.AddChar(victim->level);
			reply.AddShort(victim->mapid);
			reply.AddShort(victim->x);
			reply.AddShort(victim->y);
			reply.AddShort(victim->hp);
			reply.AddShort(victim->maxhp);
			reply.AddShort(victim->tp);
			reply.AddShort(victim->maxtp);
			reply.AddShort(victim->display_str);
			reply.AddShort(victim->display_intl);
			reply.AddShort(victim->display_wis);
			reply.AddShort(victim->display_agi);
			reply.AddShort(victim->display_con);
			reply.AddShort(victim->display_cha);
			reply.AddShort(victim->maxdam);
			reply.AddShort(victim->mindam);
			reply.AddShort(victim->accuracy);
			reply.AddShort(victim->evade);
			reply.AddShort(victim->armor);
			reply.AddShort(0); // light
			reply.AddShort(0); // dark
			reply.AddShort(0); // fire
			reply.AddShort(0); // water
			reply.AddShort(0); // earth
			reply.AddShort(0); // wind
			reply.AddChar(victim->weight);
			reply.AddChar(victim->maxweight);

			from->Send(reply);
		}
		else
		{
			from->ServerMsg(from->world->i18n.Format("command_access_denied"));
		}
	}
}